

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void bhdct_get(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,
              ion_value_t expected_value,ion_err_t expected_status,ion_result_count_t expected_count
              )

{
  long lVar1;
  planck_unit_test_t *ppVar2;
  ion_result_count_t actual;
  ion_status_t iVar3;
  planck_unit_result_t pVar4;
  void *__s;
  ion_status_t __dest;
  int iVar5;
  undefined8 uStack_60;
  planck_unit_test_t *local_58;
  planck_unit_test_t *local_50;
  ion_status_t local_48;
  ion_status_t status;
  ion_value_t retval;
  ion_value_t defaultval;
  ion_result_count_t expected_count_local;
  ion_err_t expected_status_local;
  ion_value_t expected_value_local;
  ion_key_t key_local;
  ion_dictionary_t *dict_local;
  planck_unit_test_t *tc_local;
  
  lVar1 = -((long)(dict->instance->record).value_size + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_58 + lVar1);
  iVar5 = (dict->instance->record).value_size;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1016bd;
  memset(__s,0x76,(long)iVar5);
  __dest = (ion_status_t)
           ((long)__s - ((long)(dict->instance->record).value_size + 0xfU & 0xfffffffffffffff0));
  iVar5 = (dict->instance->record).value_size;
  status = __dest;
  *(undefined8 *)((long)__dest + -8) = 0x1016f7;
  memcpy((void *)__dest,__s,(long)iVar5);
  iVar3 = status;
  *(undefined8 *)((long)__dest + -8) = 0x101708;
  local_48 = dictionary_get(dict,key,(ion_value_t)iVar3);
  iVar5 = (int)local_48.error;
  *(undefined8 *)((long)__dest + -8) = 0x101729;
  pVar4 = planck_unit_assert_int_are_equal
                    (tc,(int)expected_status,iVar5,0xad,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar4 == '\0') {
    *(undefined8 *)((long)__dest + -8) = 0x101743;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  actual = local_48.count;
  *(undefined8 *)((long)__dest + -8) = 0x10175e;
  pVar4 = planck_unit_assert_int_are_equal
                    (tc,expected_count,actual,0xae,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  iVar3 = status;
  if (pVar4 != '\0') {
    if (local_48.error == '\0') {
      iVar5 = (dict->instance->record).value_size;
      local_50 = tc;
      *(undefined8 *)((long)__dest + -8) = 0x1017a3;
      iVar5 = memcmp(expected_value,(void *)iVar3,(long)iVar5);
      ppVar2 = local_50;
      *(undefined8 *)((long)__dest + -8) = 0x1017bc;
      pVar4 = planck_unit_assert_int_are_equal
                        (ppVar2,0,iVar5,0xb1,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                        );
      if (pVar4 == '\0') {
        *(undefined8 *)((long)__dest + -8) = 0x1017d6;
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
    }
    else {
      iVar5 = (dict->instance->record).value_size;
      local_58 = tc;
      *(undefined8 *)((long)__dest + -8) = 0x1017f9;
      iVar5 = memcmp(__s,(void *)iVar3,(long)iVar5);
      ppVar2 = local_58;
      *(undefined8 *)((long)__dest + -8) = 0x101812;
      pVar4 = planck_unit_assert_int_are_equal
                        (ppVar2,0,iVar5,0xb5,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                        );
      if (pVar4 == '\0') {
        *(undefined8 *)((long)__dest + -8) = 0x10182c;
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
    }
    return;
  }
  *(undefined8 *)((long)__dest + -8) = 0x101778;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
bhdct_get(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_value_t			expected_value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count
) {
	ion_value_t defaultval = alloca(dict->instance->record.value_size);

	memset(defaultval, 0x76, dict->instance->record.value_size);

	ion_value_t retval = alloca(dict->instance->record.value_size);

	memcpy(retval, defaultval, dict->instance->record.value_size);

	ion_status_t status = dictionary_get(dict, key, retval);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, dict->instance->record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, dict->instance->record.value_size));
	}
}